

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O1

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genStructField
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Field field,Schema scope,
          Indent indent)

{
  char *pcVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  Reader list;
  Reader type;
  Reader value;
  Reader value_00;
  Reader list_00;
  bool bVar4;
  WirePointer *pWVar5;
  StructDataBitCount SVar6;
  StructPointerCount SVar7;
  unsigned_short *puVar8;
  bool bVar9;
  short sVar10;
  undefined2 uVar11;
  ushort uVar12;
  int iVar13;
  size_t result;
  StructSchema schema;
  ArrayDisposer *pAVar14;
  size_t sVar15;
  anon_union_8_2_eba6ea51_for_Type_5 params_1;
  char *pcVar16;
  long lVar17;
  ArrayPtr<const_char> *params;
  SegmentReader *pSVar18;
  int iVar19;
  StructReader *__return_storage_ptr___00;
  char (*in_R8) [2];
  anon_union_8_2_eba6ea51_for_Type_5 aVar20;
  size_t result_2;
  char *pcVar21;
  ulong uVar22;
  size_t sVar23;
  Reader RVar24;
  Type TVar25;
  CappedArray<char,_8UL> CVar26;
  StringPtr delim;
  Type type_00;
  Iterator end;
  int local_418;
  StringTree local_3d8;
  char *local_3a0;
  SegmentReader *local_398;
  size_t sStack_390;
  size_t sStack_388;
  undefined8 local_380;
  ulong local_378;
  CapnpcCapnpMain *local_370;
  String local_368;
  unsigned_short *local_350;
  Schema local_348;
  ushort local_33a;
  StringTree local_338;
  StringTree local_300;
  StringTree local_2c8;
  StringTree local_288;
  StringTree local_250;
  char *local_218;
  ulong local_210;
  ArrayPtr<const_char> local_208;
  char local_1f8 [8];
  int local_1ec;
  int local_1e8;
  char local_1e4 [4];
  StringTree local_1e0;
  ArrayPtr<const_char> local_1a8;
  ListReader local_198;
  StructReader local_168;
  StructReader local_138;
  StructReader local_108;
  ListReader local_d8;
  StructReader local_a8;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  pSVar18 = field.proto._reader.segment;
  aVar20 = (anon_union_8_2_eba6ea51_for_Type_5)field.proto._reader.capTable;
  pWVar5 = field.proto._reader.pointers;
  SVar6 = field.proto._reader.dataSize;
  SVar7 = field.proto._reader.pointerCount;
  iVar13 = field.proto._reader.nestingLimit;
  local_378 = (ulong)indent.amount;
  local_350 = (unsigned_short *)field.proto._reader.data;
  if (field.proto._reader.dataSize < 0x50) {
    sVar10 = 0;
  }
  else {
    sVar10 = *(short *)((long)field.proto._reader.data + 8);
  }
  local_370 = this;
  local_348.raw = scope.raw;
  if (sVar10 == 1) {
    local_3d8._0_16_ = StructSchema::Field::getType(&field);
    schema = Type::asStruct((Type *)&local_3d8);
    local_3d8.text.content.ptr = (char *)aVar20;
    local_3d8.text.content.size_ = (size_t)pWVar5;
    local_3d8.size_ = (size_t)pSVar18;
    local_3d8.text.content.disposer._0_4_ = iVar13;
    if (SVar7 == 0) {
      local_3d8.text.content.ptr = (char *)(RawBrandedSchema *)0x0;
      local_3d8.text.content.size_ = (size_t)(WirePointer *)0x0;
      local_3d8.size_ = (size_t)(SegmentReader *)0x0;
      local_3d8.text.content.disposer._0_4_ = 0x7fffffff;
    }
    RVar24 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_3d8,(void *)0x0,0);
    local_3d8.text.content.size_ = 0;
    local_3d8.size_ = (size_t)(SegmentReader *)0x0;
    local_3d8.text.content.ptr = (char *)(RawBrandedSchema *)0x0;
    iVar19 = 0x7fffffff;
    if (1 < SVar7) {
      local_3d8.text.content.size_ = (size_t)(pWVar5 + 1);
      local_3d8.size_ = (size_t)pSVar18;
      local_3d8.text.content.ptr = (char *)aVar20;
      iVar19 = iVar13;
    }
    local_3d8.text.content.disposer =
         (ArrayDisposer *)CONCAT44(local_3d8.text.content.disposer._4_4_,iVar19);
    _::PointerReader::getList(&local_d8,(PointerReader *)&local_3d8,INLINE_COMPOSITE,(word *)0x0);
    list.reader.capTable = local_d8.capTable;
    list.reader.segment = local_d8.segment;
    list.reader.ptr = local_d8.ptr;
    list.reader.elementCount = local_d8.elementCount;
    list.reader.step = local_d8.step;
    list.reader.structDataSize = local_d8.structDataSize;
    list.reader.structPointerCount = local_d8.structPointerCount;
    list.reader.elementSize = local_d8.elementSize;
    list.reader._39_1_ = local_d8._39_1_;
    list.reader.nestingLimit = local_d8.nestingLimit;
    list.reader._44_4_ = local_d8._44_4_;
    genAnnotations(&local_338,local_370,list,local_348);
    if ((SVar6 < 0x20) || (local_350[1] == 0)) {
      kj::StringTree::concat<>();
    }
    else {
      uVar12 = 0xffff;
      if (0x1f < SVar6) {
        uVar12 = ~local_350[1];
      }
      local_208.ptr = (char *)CONCAT62(local_208.ptr._2_6_,uVar12);
      kj::strTree<char_const(&)[17],unsigned_short>
                (&local_300,(kj *)"  # union tag = ",(char (*) [17])&local_208,local_350);
    }
    genStructFields((Array<kj::StringTree> *)&local_288,local_370,schema,(Indent)(indent.amount + 2)
                   );
    delim.content.size_ = 1;
    delim.content.ptr = "";
    kj::StringTree::StringTree(&local_250,(Array<kj::StringTree> *)&local_288,delim);
    aVar20.schema = (RawBrandedSchema *)(RVar24.super_StringPtr.content.size_ - 1);
    local_368.content.ptr = (char *)CONCAT44(local_368.content.ptr._4_4_,indent.amount);
    local_1e0.size_ = 0x197876;
    local_1e0.text.content.ptr = (char *)0x2;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    (__return_storage_ptr__->text).content.size_ = 0;
    (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
    __return_storage_ptr__->size_ = 0;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
    pSVar18 = (SegmentReader *)(ulong)indent.amount;
    local_3d8.text.content.ptr = (char *)aVar20.schema;
    local_3d8.size_ = (size_t)pSVar18;
    local_3d8.text.content.size_ = 7;
    local_3d8.text.content.disposer = (ArrayDisposer *)local_338.size_;
    local_3d8.branches.ptr = (Branch *)0x2;
    local_3d8.branches.size_ = local_300.size_;
    local_3d8.branches.disposer = (ArrayDisposer *)0x1;
    local_3a0 = (char *)local_250.size_;
    local_398 = pSVar18;
    sStack_390 = 2;
    sVar15 = 0;
    lVar17 = 0;
    do {
      sVar15 = sVar15 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x50);
    __return_storage_ptr__->size_ = sVar15;
    local_3d8.text.content.size_ = 7;
    sVar15 = 0;
    local_3d8.text.content.disposer = (ArrayDisposer *)0x0;
    local_3d8.branches.ptr = (Branch *)0x2;
    local_3d8.branches.size_ = 0;
    local_3d8.branches.disposer = (ArrayDisposer *)0x1;
    local_3a0 = (char *)0x0;
    sStack_390 = 2;
    lVar17 = 0;
    do {
      sVar15 = sVar15 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x50);
    kj::heapString((String *)&local_2c8,sVar15);
    pcVar16 = (__return_storage_ptr__->text).content.ptr;
    if (pcVar16 != (char *)0x0) {
      sVar15 = (__return_storage_ptr__->text).content.size_;
      (__return_storage_ptr__->text).content.ptr = (char *)0x0;
      (__return_storage_ptr__->text).content.size_ = 0;
      pAVar14 = (__return_storage_ptr__->text).content.disposer;
      (*(code *)**(undefined8 **)pAVar14)(pAVar14,pcVar16,1,sVar15,sVar15,0);
    }
    pcVar1 = local_2c8.text.content.ptr;
    pcVar16 = (char *)local_2c8.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)local_2c8.size_;
    (__return_storage_ptr__->text).content.size_ = (size_t)local_2c8.text.content.ptr;
    (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)local_2c8.text.content.size_;
    pcVar21 = (char *)0x0;
    local_3d8.text.content.size_ = 0;
    local_3d8._0_16_ = ZEXT816(0);
    local_3d8.text.content.disposer = (ArrayDisposer *)0x1;
    local_3d8.branches.ptr = (Branch *)0x0;
    local_3d8.branches.size_ = 1;
    local_3d8.branches.disposer = (ArrayDisposer *)0x0;
    local_3a0 = (char *)0x1;
    local_398 = (SegmentReader *)0x0;
    sStack_390 = 0;
    lVar17 = 0;
    do {
      pcVar21 = pcVar21 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x50);
    local_2c8.size_ =
         (size_t)kj::_::HeapArrayDisposer::allocateImpl
                           (0x40,(size_t)pcVar21,(size_t)pcVar21,
                            kj::_::HeapArrayDisposer::
                            Allocate_<kj::StringTree::Branch,_false,_false>::construct,
                            kj::_::HeapArrayDisposer::
                            Allocate_<kj::StringTree::Branch,_false,_false>::destruct);
    local_2c8.text.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
    pBVar3 = (__return_storage_ptr__->branches).ptr;
    local_2c8.text.content.ptr = pcVar21;
    if (pBVar3 != (Branch *)0x0) {
      sVar15 = (__return_storage_ptr__->branches).size_;
      (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
      (__return_storage_ptr__->branches).size_ = 0;
      pAVar14 = (__return_storage_ptr__->branches).disposer;
      (*(code *)**(undefined8 **)pAVar14)
                (pAVar14,pBVar3,0x40,sVar15,sVar15,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar15 = local_2c8.size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)local_2c8.size_;
    (__return_storage_ptr__->branches).size_ = (size_t)local_2c8.text.content.ptr;
    (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)local_2c8.text.content.size_;
    pcVar21 = pcVar16;
    if (pcVar1 == (char *)0x0) {
      pcVar21 = (char *)0x0;
    }
    if ((int)local_378 != 0) {
      memset(pcVar21,0x20,(size_t)pSVar18);
      pcVar21 = pcVar21 + (long)pSVar18;
    }
    if (aVar20.schema != (RawBrandedSchema *)0x0) {
      memcpy(pcVar21,RVar24.super_StringPtr.content.ptr,aVar20.scopeId);
      pcVar21 = pcVar21 + (long)aVar20.schema;
    }
    builtin_strncpy(pcVar21," :group",7);
    if (pcVar1 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    *(size_t *)sVar15 = (size_t)(pcVar21 + (7 - (long)pcVar16));
    ((StringTree *)(sVar15 + 8))->size_ = local_338.size_;
    pcVar1 = (((StringTree *)(sVar15 + 8))->text).content.ptr;
    if (pcVar1 != (char *)0x0) {
      sVar23 = (((StringTree *)(sVar15 + 8))->text).content.size_;
      (((StringTree *)(sVar15 + 8))->text).content.ptr = (char *)0x0;
      (((StringTree *)(sVar15 + 8))->text).content.size_ = 0;
      pAVar14 = (((StringTree *)(sVar15 + 8))->text).content.disposer;
      (*(code *)**(undefined8 **)pAVar14)(pAVar14,pcVar1,1,sVar23,sVar23,0);
    }
    (((StringTree *)(sVar15 + 8))->text).content.ptr = local_338.text.content.ptr;
    (((StringTree *)(sVar15 + 8))->text).content.size_ = local_338.text.content.size_;
    (((StringTree *)(sVar15 + 8))->text).content.disposer = local_338.text.content.disposer;
    local_338.text.content.ptr = (char *)0x0;
    local_338.text.content.size_ = 0;
    pBVar3 = (((StringTree *)(sVar15 + 8))->branches).ptr;
    if (pBVar3 != (Branch *)0x0) {
      sVar23 = (((StringTree *)(sVar15 + 8))->branches).size_;
      (((StringTree *)(sVar15 + 8))->branches).ptr = (Branch *)0x0;
      (((StringTree *)(sVar15 + 8))->branches).size_ = 0;
      pAVar14 = (((StringTree *)(sVar15 + 8))->branches).disposer;
      (*(code *)**(undefined8 **)pAVar14)
                (pAVar14,pBVar3,0x40,sVar23,sVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    (((StringTree *)(sVar15 + 8))->branches).ptr = local_338.branches.ptr;
    (((StringTree *)(sVar15 + 8))->branches).size_ = local_338.branches.size_;
    (((StringTree *)(sVar15 + 8))->branches).disposer = local_338.branches.disposer;
    local_338.branches.ptr = (Branch *)0x0;
    local_338.branches.size_ = 0;
    pcVar21[7] = ' ';
    pcVar21[8] = '{';
    ((Branch *)(sVar15 + 0x40))->index = (size_t)(pcVar21 + (9 - (long)pcVar16));
    (((Branch *)(sVar15 + 0x40))->content).size_ = local_300.size_;
    pcVar16 = (((Branch *)(sVar15 + 0x40))->content).text.content.ptr;
    if (pcVar16 != (char *)0x0) {
      sVar23 = (((Branch *)(sVar15 + 0x40))->content).text.content.size_;
      (((Branch *)(sVar15 + 0x40))->content).text.content.ptr = (char *)0x0;
      (((Branch *)(sVar15 + 0x40))->content).text.content.size_ = 0;
      pAVar14 = (((Branch *)(sVar15 + 0x40))->content).text.content.disposer;
      (*(code *)**(undefined8 **)pAVar14)(pAVar14,pcVar16,1,sVar23,sVar23,0);
    }
    (((Branch *)(sVar15 + 0x40))->content).text.content.ptr = local_300.text.content.ptr;
    (((Branch *)(sVar15 + 0x40))->content).text.content.size_ = local_300.text.content.size_;
    (((Branch *)(sVar15 + 0x40))->content).text.content.disposer = local_300.text.content.disposer;
    local_300.text.content.ptr = (char *)0x0;
    local_300.text.content.size_ = 0;
    pBVar3 = (((Branch *)(sVar15 + 0x40))->content).branches.ptr;
    if (pBVar3 != (Branch *)0x0) {
      sVar23 = (((Branch *)(sVar15 + 0x40))->content).branches.size_;
      (((Branch *)(sVar15 + 0x40))->content).branches.ptr = (Branch *)0x0;
      (((Branch *)(sVar15 + 0x40))->content).branches.size_ = 0;
      pAVar14 = (((Branch *)(sVar15 + 0x40))->content).branches.disposer;
      (*(code *)**(undefined8 **)pAVar14)
                (pAVar14,pBVar3,0x40,sVar23,sVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    (((Branch *)(sVar15 + 0x40))->content).branches.ptr = local_300.branches.ptr;
    (((Branch *)(sVar15 + 0x40))->content).branches.size_ = local_300.branches.size_;
    (((Branch *)(sVar15 + 0x40))->content).branches.disposer = local_300.branches.disposer;
    local_300.branches.ptr = (Branch *)0x0;
    local_300.branches.size_ = 0;
    pcVar21[9] = '\n';
    kj::StringTree::fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
              (__return_storage_ptr__,pcVar21 + 10,2,&local_250,(Indent *)&local_368,
               (ArrayPtr<const_char> *)&local_1e0);
    sVar15 = local_250.branches.size_;
    pBVar3 = local_250.branches.ptr;
    if (local_250.branches.ptr != (Branch *)0x0) {
      local_250.branches.ptr = (Branch *)0x0;
      local_250.branches.size_ = 0;
      (*(code *)**(undefined8 **)local_250.branches.disposer)
                (local_250.branches.disposer,pBVar3,0x40,sVar15,sVar15,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar15 = local_250.text.content.size_;
    pcVar16 = local_250.text.content.ptr;
    if (local_250.text.content.ptr != (char *)0x0) {
      local_250.text.content.ptr = (char *)0x0;
      local_250.text.content.size_ = 0;
      (*(code *)**(undefined8 **)local_250.text.content.disposer)
                (local_250.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
    }
    pcVar16 = local_288.text.content.ptr;
    sVar15 = local_288.size_;
    if (local_288.size_ != 0) {
      local_288.size_ = 0;
      local_288.text.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_288.text.content.size_)
                (local_288.text.content.size_,sVar15,0x38,pcVar16,pcVar16,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    sVar15 = local_300.branches.size_;
    pBVar3 = local_300.branches.ptr;
    if (local_300.branches.ptr != (Branch *)0x0) {
      local_300.branches.ptr = (Branch *)0x0;
      local_300.branches.size_ = 0;
      (*(code *)**(undefined8 **)local_300.branches.disposer)
                (local_300.branches.disposer,pBVar3,0x40,sVar15,sVar15,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar15 = local_300.text.content.size_;
    pcVar16 = local_300.text.content.ptr;
    if (local_300.text.content.ptr != (char *)0x0) {
      local_300.text.content.ptr = (char *)0x0;
      local_300.text.content.size_ = 0;
      (*(code *)**(undefined8 **)local_300.text.content.disposer)
                (local_300.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
    }
    sVar15 = local_338.branches.size_;
    pBVar3 = local_338.branches.ptr;
    if (local_338.branches.ptr != (Branch *)0x0) {
      local_338.branches.ptr = (Branch *)0x0;
      local_338.branches.size_ = 0;
      (*(code *)**(undefined8 **)local_338.branches.disposer)
                (local_338.branches.disposer,pBVar3,0x40,sVar15,sVar15,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar15 = local_338.text.content.size_;
    pcVar16 = local_338.text.content.ptr;
    if (local_338.text.content.ptr == (char *)0x0) {
      return __return_storage_ptr__;
    }
    local_338.text.content.ptr = (char *)0x0;
    local_338.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_338.text.content.disposer)
              (local_338.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
    return __return_storage_ptr__;
  }
  if (sVar10 != 0) {
    kj::StringTree::concat<>();
    return __return_storage_ptr__;
  }
  if (field.proto._reader.pointerCount < 3) {
    local_3d8.text.content.disposer._0_4_ = 0x7fffffff;
    local_3d8.text.content.ptr = (char *)0x0;
    local_3d8.text.content.size_ = 0;
    local_3d8.size_ = 0;
  }
  else {
    local_3d8.text.content.size_ = (size_t)(field.proto._reader.pointers + 2);
    local_3d8.text.content.ptr = (char *)field.proto._reader.capTable;
    local_3d8.size_ = (size_t)field.proto._reader.segment;
    local_3d8.text.content.disposer._0_4_ = field.proto._reader.nestingLimit;
  }
  local_418 = 0;
  _::PointerReader::getStruct(&local_108,(PointerReader *)&local_3d8,(word *)0x0);
  uVar11 = 0;
  if (0xf < local_108.dataSize) {
    uVar11 = *local_108.data;
  }
  switch(uVar11) {
  case 1:
    local_418 = 1;
    break;
  case 2:
  case 6:
    local_418 = 8;
    break;
  case 3:
  case 7:
  case 0xf:
    local_418 = 0x10;
    break;
  case 4:
  case 8:
  case 10:
    local_418 = 0x20;
    break;
  case 5:
  case 9:
  case 0xb:
    local_418 = 0x40;
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
    local_418 = -1;
    bVar4 = true;
    goto LAB_0014258f;
  }
  bVar4 = false;
LAB_0014258f:
  local_3d8.text.content.ptr = (char *)aVar20;
  local_3d8.text.content.size_ = (size_t)pWVar5;
  local_3d8.size_ = (size_t)pSVar18;
  local_3d8.text.content.disposer._0_4_ = iVar13;
  if (SVar7 == 0) {
    local_3d8.text.content.ptr = (char *)(RawBrandedSchema *)0x0;
    local_3d8.text.content.size_ = (size_t)(WirePointer *)0x0;
    local_3d8.size_ = (size_t)(SegmentReader *)0x0;
    local_3d8.text.content.disposer._0_4_ = 0x7fffffff;
  }
  uVar22 = 0;
  RVar24 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_3d8,(void *)0x0,0);
  local_218 = RVar24.super_StringPtr.content.ptr;
  if (0x6f < SVar6) {
    uVar22 = (ulong)local_350[6];
  }
  if (SVar7 < 3) {
    local_3d8.text.content.ptr = (char *)0x0;
    local_3d8.text.content.disposer._0_4_ = 0x7fffffff;
    local_3d8.text.content.size_ = 0;
    local_3d8.size_ = 0;
  }
  else {
    local_3d8.text.content.size_ = (size_t)(pWVar5 + 2);
    local_3d8.text.content.ptr = (char *)aVar20;
    local_3d8.size_ = (size_t)pSVar18;
    local_3d8.text.content.disposer._0_4_ = iVar13;
  }
  local_210 = uVar22;
  _::PointerReader::getStruct(&local_a8,(PointerReader *)&local_3d8,(word *)0x0);
  local_78.ptr.isSet = false;
  type._reader.capTable = local_a8.capTable;
  type._reader.segment = local_a8.segment;
  type._reader.data = local_a8.data;
  type._reader.pointers = local_a8.pointers;
  type._reader.dataSize = local_a8.dataSize;
  type._reader.pointerCount = local_a8.pointerCount;
  type._reader._38_2_ = local_a8._38_2_;
  type._reader.nestingLimit = local_a8.nestingLimit;
  type._reader._44_4_ = local_a8._44_4_;
  genType(&local_250,local_370,type,local_348,&local_78);
  if (SVar7 < 4) {
    local_3d8.text.content.disposer._0_4_ = 0x7fffffff;
    local_3d8.text.content.ptr = (char *)0x0;
    local_3d8.text.content.size_ = 0;
    local_3d8.size_ = 0;
  }
  else {
    local_3d8.text.content.size_ = (size_t)(pWVar5 + 3);
    local_3d8.text.content.ptr = (char *)aVar20;
    local_3d8.size_ = (size_t)pSVar18;
    local_3d8.text.content.disposer._0_4_ = iVar13;
  }
  __return_storage_ptr___00 = &local_138;
  _::PointerReader::getStruct(__return_storage_ptr___00,(PointerReader *)&local_3d8,(word *)0x0);
  value._reader.capTable = local_138.capTable;
  value._reader.segment = local_138.segment;
  value._reader.data = local_138.data;
  value._reader.pointers = local_138.pointers;
  value._reader.dataSize = local_138.dataSize;
  value._reader.pointerCount = local_138.pointerCount;
  value._reader._38_2_ = local_138._38_2_;
  value._reader.nestingLimit = local_138.nestingLimit;
  value._reader._44_4_ = local_138._44_4_;
  bVar9 = isEmptyValue((CapnpcCapnpMain *)__return_storage_ptr___00,value);
  if (bVar9) {
    local_3d8.size_ = 0x1a7eaf;
    local_3d8.text.content.ptr = (char *)0x0;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>(&local_338,&local_3d8,params);
  }
  else {
    TVar25 = StructSchema::Field::getType(&field);
    type_00._0_8_ = TVar25.field_4;
    if (SVar7 < 4) {
      params_1.scopeId = 0x7fffffff;
      local_3d8.text.content.ptr = (char *)0x0;
      local_3d8.text.content.size_ = 0;
      local_3d8.size_ = 0;
    }
    else {
      local_3d8.text.content.size_ = (size_t)(pWVar5 + 3);
      params_1.scopeId._4_4_ = 0;
      params_1.scopeId._0_4_ = iVar13;
      local_3d8.text.content.ptr = (char *)aVar20;
      local_3d8.size_ = (size_t)pSVar18;
    }
    local_3d8.text.content.disposer._0_4_ = (int)params_1.scopeId;
    _::PointerReader::getStruct(&local_168,(PointerReader *)&local_3d8,(word *)0x0);
    value_00._reader.capTable = local_168.capTable;
    value_00._reader.segment = local_168.segment;
    value_00._reader.data = local_168.data;
    value_00._reader.pointers = local_168.pointers;
    value_00._reader.dataSize = local_168.dataSize;
    value_00._reader.pointerCount = local_168.pointerCount;
    value_00._reader._38_2_ = local_168._38_2_;
    value_00._reader.nestingLimit = local_168.nestingLimit;
    value_00._reader._44_4_ = local_168._44_4_;
    type_00.field_4.schema = params_1.schema;
    genValue(&local_300,TVar25._0_8_,type_00,value_00);
    local_3d8.size_ = 0x197937;
    local_3d8.text.content.ptr = (char *)0x3;
    kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
              (&local_338,&local_3d8,(ArrayPtr<const_char> *)&local_300,
               (StringTree *)params_1.schema);
  }
  if (SVar7 < 2) {
    iVar13 = 0x7fffffff;
    aVar20.schema = (RawBrandedSchema *)0x0;
    local_3d8.text.content.size_ = 0;
    pSVar18 = (SegmentReader *)0x0;
  }
  else {
    local_3d8.text.content.size_ = (size_t)(pWVar5 + 1);
  }
  local_3d8.text.content.ptr = (char *)aVar20.schema;
  local_3d8.size_ = (size_t)pSVar18;
  local_3d8.text.content.disposer =
       (ArrayDisposer *)CONCAT44(local_3d8.text.content.disposer._4_4_,iVar13);
  _::PointerReader::getList(&local_198,(PointerReader *)&local_3d8,INLINE_COMPOSITE,(word *)0x0);
  list_00.reader.capTable = local_198.capTable;
  list_00.reader.segment = local_198.segment;
  list_00.reader.ptr = local_198.ptr;
  list_00.reader.elementCount = local_198.elementCount;
  list_00.reader.step = local_198.step;
  list_00.reader.structDataSize = local_198.structDataSize;
  list_00.reader.structPointerCount = local_198.structPointerCount;
  list_00.reader.elementSize = local_198.elementSize;
  list_00.reader._39_1_ = local_198._39_1_;
  list_00.reader.nestingLimit = local_198.nestingLimit;
  list_00.reader._44_4_ = local_198._44_4_;
  genAnnotations(&local_2c8,local_370,list_00,local_348);
  puVar8 = local_350;
  if (bVar4) {
    local_1e4[0] = '\0';
    local_1e4[1] = '\0';
    local_1e4[2] = '\0';
    local_1e4[3] = '\0';
    if (0x3f < SVar6) {
      local_1e4 = *(char (*) [4])(local_350 + 2);
    }
    pcVar16 = "]";
    kj::strTree<char_const(&)[5],unsigned_int,char_const(&)[2]>
              (&local_288,(kj *)"ptr[",(char (*) [5])local_1e4,(uint *)0x1a2c15,in_R8);
  }
  else {
    if (SVar6 < 0x40) {
      local_1ec = 1;
      local_1e8 = 0;
    }
    else {
      local_1e8 = *(int *)(local_350 + 2) * local_418;
      local_1ec = *(int *)(local_350 + 2) + 1;
    }
    local_1ec = local_1ec * local_418;
    pcVar16 = ", ";
    kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
              (&local_288,(kj *)"bits[",(char (*) [6])&local_1e8,(uint *)", ",
               (char (*) [3])&local_1ec,(uint *)0x1a39c7,(char (*) [2])local_198.segment);
  }
  if ((SVar6 < 0x20) || (puVar8[1] == 0)) {
    kj::StringTree::concat<>();
  }
  else {
    local_33a = 0xffff;
    if (0x1f < SVar6) {
      local_33a = ~puVar8[1];
    }
    kj::strTree<char_const(&)[15],unsigned_short>
              (&local_1e0,(kj *)", union tag = ",(char (*) [15])&local_33a,(unsigned_short *)pcVar16
              );
  }
  CVar26 = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,(unsigned_short)local_210);
  local_1f8 = CVar26.content;
  pAVar14 = (ArrayDisposer *)CVar26.currentSize;
  aVar20.schema = (RawBrandedSchema *)(RVar24.super_StringPtr.content.size_ - 1);
  local_208.ptr = ";  # ";
  local_208.size_ = 5;
  local_1a8.ptr = "\n";
  local_1a8.size_ = 1;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  pSVar18 = (SegmentReader *)(local_378 & 0xffffffff);
  local_3d8.text.content.ptr = (char *)aVar20.schema;
  local_3d8.size_ = (size_t)pSVar18;
  local_3d8.text.content.size_ = 2;
  local_3d8.text.content.disposer = pAVar14;
  local_3d8.branches.ptr = (Branch *)0x2;
  local_3d8.branches.size_ = local_250.size_;
  local_3d8.branches.disposer = (ArrayDisposer *)local_338.size_;
  local_3a0 = (char *)local_2c8.size_;
  local_398 = (SegmentReader *)0x5;
  sStack_390 = local_288.size_;
  sStack_388 = local_1e0.size_;
  local_380 = 1;
  sVar15 = 0;
  lVar17 = 0;
  do {
    sVar15 = sVar15 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x60);
  __return_storage_ptr__->size_ = sVar15;
  local_3d8.text.content.size_ = 2;
  local_3d8.branches.ptr = (Branch *)0x2;
  local_3d8.branches.size_ = 0;
  local_3d8.branches.disposer = (ArrayDisposer *)0x0;
  local_3a0 = (char *)0x0;
  local_398 = (SegmentReader *)0x5;
  sStack_390 = 0;
  sStack_388 = 0;
  local_380 = 1;
  sVar15 = 0;
  lVar17 = 0;
  do {
    sVar15 = sVar15 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x60);
  kj::heapString(&local_368,sVar15);
  pcVar16 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar16 != (char *)0x0) {
    sVar15 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar2 = (__return_storage_ptr__->text).content.disposer;
    (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar16,1,sVar15,sVar15,0);
  }
  sVar15 = local_368.content.size_;
  pcVar16 = local_368.content.ptr;
  (__return_storage_ptr__->text).content.ptr = local_368.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_368.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_368.content.disposer;
  sVar23 = 0;
  local_3d8.branches.ptr = (Branch *)0x0;
  local_3d8.text.content.size_ = 0;
  local_3d8.text.content.disposer = (ArrayDisposer *)0x0;
  local_3d8._0_16_ = ZEXT816(0);
  local_3d8.branches.size_ = 1;
  local_3d8.branches.disposer = (ArrayDisposer *)0x1;
  local_3a0 = (char *)0x1;
  local_398 = (SegmentReader *)0x0;
  sStack_390 = 1;
  sStack_388 = 1;
  local_380 = 0;
  lVar17 = 0;
  do {
    sVar23 = sVar23 + *(long *)((long)&((Type *)&local_3d8)->baseType + lVar17);
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x60);
  local_368.content.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar23,sVar23,
                          kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                          ::construct,
                          kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                          ::destruct);
  local_368.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar3 = (__return_storage_ptr__->branches).ptr;
  local_368.content.size_ = sVar23;
  if (pBVar3 != (Branch *)0x0) {
    sVar23 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar2 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar2)
              (pAVar2,pBVar3,0x40,sVar23,sVar23,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_368.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_368.content.size_;
  (__return_storage_ptr__->branches).disposer = local_368.content.disposer;
  if (sVar15 == 0) {
    pcVar16 = (char *)0x0;
  }
  if ((int)local_378 != 0) {
    memset(pcVar16,0x20,(size_t)pSVar18);
    pcVar16 = pcVar16 + (long)pSVar18;
  }
  if (aVar20.schema != (RawBrandedSchema *)0x0) {
    memcpy(pcVar16,local_218,aVar20.scopeId);
    pcVar16 = pcVar16 + (long)aVar20.schema;
  }
  pcVar16[0] = ' ';
  pcVar16[1] = '@';
  pcVar16 = pcVar16 + 2;
  if (pAVar14 != (ArrayDisposer *)0x0) {
    memcpy(pcVar16,local_1f8,(size_t)pAVar14);
    pcVar16 = pcVar16 + (long)pAVar14;
  }
  pcVar16[0] = ' ';
  pcVar16[1] = ':';
  kj::StringTree::
  fill<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar16 + 2,0,&local_250,&local_338,&local_2c8,&local_208,
             &local_288,&local_1e0,&local_1a8);
  sVar15 = local_1e0.branches.size_;
  pBVar3 = local_1e0.branches.ptr;
  if (local_1e0.branches.ptr != (Branch *)0x0) {
    local_1e0.branches.ptr = (Branch *)0x0;
    local_1e0.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_1e0.branches.disposer)
              (local_1e0.branches.disposer,pBVar3,0x40,sVar15,sVar15,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar15 = local_1e0.text.content.size_;
  pcVar16 = local_1e0.text.content.ptr;
  if (local_1e0.text.content.ptr != (char *)0x0) {
    local_1e0.text.content.ptr = (char *)0x0;
    local_1e0.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1e0.text.content.disposer)
              (local_1e0.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
  }
  sVar15 = local_288.branches.size_;
  pBVar3 = local_288.branches.ptr;
  if (local_288.branches.ptr != (Branch *)0x0) {
    local_288.branches.ptr = (Branch *)0x0;
    local_288.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_288.branches.disposer)
              (local_288.branches.disposer,pBVar3,0x40,sVar15,sVar15,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar15 = local_288.text.content.size_;
  pcVar16 = local_288.text.content.ptr;
  if (local_288.text.content.ptr != (char *)0x0) {
    local_288.text.content.ptr = (char *)0x0;
    local_288.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_288.text.content.disposer)
              (local_288.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
  }
  sVar15 = local_2c8.branches.size_;
  pBVar3 = local_2c8.branches.ptr;
  if (local_2c8.branches.ptr != (Branch *)0x0) {
    local_2c8.branches.ptr = (Branch *)0x0;
    local_2c8.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_2c8.branches.disposer)
              (local_2c8.branches.disposer,pBVar3,0x40,sVar15,sVar15,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar15 = local_2c8.text.content.size_;
  pcVar16 = local_2c8.text.content.ptr;
  if (local_2c8.text.content.ptr != (char *)0x0) {
    local_2c8.text.content.ptr = (char *)0x0;
    local_2c8.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_2c8.text.content.disposer)
              (local_2c8.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
  }
  sVar15 = local_338.branches.size_;
  pBVar3 = local_338.branches.ptr;
  if (local_338.branches.ptr != (Branch *)0x0) {
    local_338.branches.ptr = (Branch *)0x0;
    local_338.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_338.branches.disposer)
              (local_338.branches.disposer,pBVar3,0x40,sVar15,sVar15,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar15 = local_338.text.content.size_;
  pcVar16 = local_338.text.content.ptr;
  if (local_338.text.content.ptr != (char *)0x0) {
    local_338.text.content.ptr = (char *)0x0;
    local_338.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_338.text.content.disposer)
              (local_338.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
  }
  sVar15 = local_300.branches.size_;
  pBVar3 = local_300.branches.ptr;
  if (!bVar9) {
    if (local_300.branches.ptr != (Branch *)0x0) {
      local_300.branches.ptr = (Branch *)0x0;
      local_300.branches.size_ = 0;
      (*(code *)**(undefined8 **)local_300.branches.disposer)
                (local_300.branches.disposer,pBVar3,0x40,sVar15,sVar15,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar15 = local_300.text.content.size_;
    pcVar16 = local_300.text.content.ptr;
    if (local_300.text.content.ptr != (char *)0x0) {
      local_300.text.content.ptr = (char *)0x0;
      local_300.text.content.size_ = 0;
      (*(code *)**(undefined8 **)local_300.text.content.disposer)
                (local_300.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
    }
  }
  sVar15 = local_250.branches.size_;
  pBVar3 = local_250.branches.ptr;
  if (local_250.branches.ptr != (Branch *)0x0) {
    local_250.branches.ptr = (Branch *)0x0;
    local_250.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_250.branches.disposer)
              (local_250.branches.disposer,pBVar3,0x40,sVar15,sVar15,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar15 = local_250.text.content.size_;
  pcVar16 = local_250.text.content.ptr;
  if (local_250.text.content.ptr != (char *)0x0) {
    local_250.text.content.ptr = (char *)0x0;
    local_250.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_250.text.content.disposer)
              (local_250.text.content.disposer,pcVar16,1,sVar15,sVar15,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genStructField(StructSchema::Field field, Schema scope, Indent indent) {
    auto proto = field.getProto();
    switch (proto.which()) {
      case schema::Field::SLOT: {
        auto slot = proto.getSlot();
        int size = typeSizeBits(slot.getType());
        return kj::strTree(
            indent, proto.getName(), " @", proto.getOrdinal().getExplicit(),
            " :", genType(slot.getType(), scope, nullptr),
            isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
            genAnnotations(proto.getAnnotations(), scope),
            ";  # ", size == -1 ? kj::strTree("ptr[", slot.getOffset(), "]")
                                : kj::strTree("bits[", slot.getOffset() * size, ", ",
                                              (slot.getOffset() + 1) * size, ")"),
            hasDiscriminantValue(proto)
                ? kj::strTree(", union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n");
      }
      case schema::Field::GROUP: {
        auto group = field.getType().asStruct();
        return kj::strTree(
            indent, proto.getName(),
            " :group", genAnnotations(proto.getAnnotations(), scope), " {",
            hasDiscriminantValue(proto)
                ? kj::strTree("  # union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n",
            genStructFields(group, indent.next()),
            indent, "}\n");
      }
    }
    return kj::strTree();
  }